

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

_List_iterator<long>
UnitTests::OutputElement<std::_List_iterator<long>>
          (ostream *os,_List_iterator<long> iter,_List_iterator<long> end)

{
  if (iter._M_node == end._M_node) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"##EOF!##",8);
  }
  else {
    std::ostream::_M_insert<long>((long)os);
    iter._M_node = (iter._M_node)->_M_next;
  }
  return (_List_iterator<long>)iter._M_node;
}

Assistant:

It OutputElement(std::ostream& os, It iter, It end)
    {
        if (iter != end)
        {
            os << stream(*iter);
            return ++iter;
        }
        os << "##EOF!##";
        return iter;
    }